

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGsContainer.cpp
# Opt level: O0

void __thiscall CFGsContainer::dumpAll(CFGsContainer *this,char *directory)

{
  CFG *this_00;
  bool bVar1;
  Status SVar2;
  pointer ppVar3;
  ostream *poVar4;
  void *this_01;
  Addr AVar5;
  string local_1e8 [48];
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [376];
  CFG *local_30;
  CFG *cfg;
  iterator ed;
  iterator it;
  char *directory_local;
  CFGsContainer *this_local;
  
  ed = std::
       map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
       ::begin(&this->m_cfgsMap);
  cfg = (CFG *)std::
               map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
               ::end(&this->m_cfgsMap);
  while (bVar1 = std::operator!=(&ed,(_Self *)&cfg), bVar1) {
    ppVar3 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CFG_*>_>::operator->(&ed);
    local_30 = ppVar3->second;
    SVar2 = CFG::status(local_30);
    if (SVar2 == VALID) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar4 = std::operator<<(local_1a8,directory);
      poVar4 = std::operator<<(poVar4,"/cfg");
      poVar4 = std::operator<<(poVar4,(string *)&this->m_name);
      poVar4 = std::operator<<(poVar4,"-0x");
      this_01 = (void *)std::ostream::operator<<(poVar4,std::hex);
      AVar5 = CFG::addr(local_30);
      poVar4 = (ostream *)std::ostream::operator<<(this_01,AVar5);
      std::operator<<(poVar4,".dot");
      this_00 = local_30;
      std::__cxx11::stringstream::str();
      CFG::dumpDOT(this_00,local_1e8);
      std::__cxx11::string::~string((string *)local_1e8);
      std::__cxx11::stringstream::~stringstream(local_1b8);
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CFG_*>_>::operator++(&ed,0);
  }
  return;
}

Assistant:

void CFGsContainer::dumpAll(const char* directory) {
	for (std::map<Addr, CFG*>::iterator it = m_cfgsMap.begin(),
			ed = m_cfgsMap.end(); it != ed; it++) {
		CFG* cfg = it->second;
		if (cfg->status() != CFG::VALID)
			continue;

		std::stringstream ss;
		ss << directory << "/cfg" << m_name << "-0x" << std::hex << cfg->addr() << ".dot";
		cfg->dumpDOT(ss.str());
	}
}